

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::PhraseTests_AllConsistentPairsSizeTwo_Test::TestBody
          (PhraseTests_AllConsistentPairsSizeTwo_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *message;
  char *in_RCX;
  string_view sv;
  AssertHelper local_98;
  Message local_90;
  size_type local_88;
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  value_type f;
  undefined1 local_50 [8];
  vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> sps;
  size_t local_30;
  undefined1 local_28 [8];
  Alignment a;
  PhraseTests_AllConsistentPairsSizeTwo_Test *this_local;
  
  a.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &sps.super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,"0-0 1-1");
  sv._M_str = in_RCX;
  sv._M_len = local_30;
  readAlignment((Alignment *)local_28,
                (thrax *)sps.
                         super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,sv);
  minimalConsistentPairs
            ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)local_50,
             (Alignment *)local_28,2);
  pvVar2 = std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::front
                     ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)
                      local_50);
  gtest_ar.message_.ptr_ =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pvVar2;
  local_7c = 3;
  local_88 = std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::size
                       ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)
                        local_50);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_78,"3","sps.size()",&local_7c,&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::~vector
            ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)local_50);
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~vector
            ((vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> *)local_28);
  return;
}

Assistant:

TEST(PhraseTests, AllConsistentPairsSizeTwo) {
  auto a = readAlignment("0-0 1-1");
  auto sps = minimalConsistentPairs(a, 2);
  auto f = sps.front();
  EXPECT_EQ(3, sps.size());
}